

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
          (InternalMetadata *this,string *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  pbVar1 = mutable_unknown_fields<std::__cxx11::string>(this);
  std::__cxx11::string::append((string *)pbVar1);
  return;
}

Assistant:

void InternalMetadata::DoMergeFrom<std::string>(const std::string& other) {
  mutable_unknown_fields<std::string>()->append(other);
}